

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  undefined8 *puVar1;
  ssize_t sVar2;
  int *piVar3;
  long *plVar4;
  long *extraout_RAX;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  long *extraout_RDX;
  ulong uVar9;
  undefined8 uVar10;
  char status_ch;
  undefined1 local_139;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  int local_b4;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  plVar6 = (long *)0x4c;
  if (reason != TEST_DID_NOT_DIE) {
    plVar6 = (long *)(ulong)(byte)((reason == TEST_THREW_EXCEPTION) * '\x02' + 0x52);
  }
  local_139 = SUB81(plVar6,0);
  do {
    sVar2 = write(this->write_fd_,&local_139,1);
    if ((int)sVar2 != -1) {
      _Exit(1);
      plVar4 = extraout_RAX;
      local_90 = extraout_RDX;
      goto LAB_0029b4de;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
LAB_0029b4de:
    local_80 = *plVar6;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_118 = (ulong *)*plVar6;
  puVar7 = (ulong *)(plVar6 + 2);
  if (local_118 == puVar7) {
    local_108 = *puVar7;
    lStack_100 = plVar6[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar7;
  }
  local_110 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_b4 = 0x20d;
  StreamableToString<int>(&local_b0,&local_b4);
  uVar9 = 0xf;
  if (local_118 != &local_108) {
    uVar9 = local_108;
  }
  if (uVar9 < local_b0._M_string_length + local_110) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_110 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
      goto LAB_0029b5e9;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
LAB_0029b5e9:
  local_138 = (undefined8 *)*puVar5;
  puVar1 = puVar5 + 2;
  if (local_138 == puVar1) {
    local_128 = *puVar1;
    uStack_120 = puVar5[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar1;
  }
  local_130 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_d8 = (long *)*plVar6;
  plVar4 = plVar6 + 2;
  if (local_d8 == plVar4) {
    local_c8 = *plVar4;
    lStack_c0 = plVar6[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar4;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar4;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_f8 = (long *)*plVar6;
  plVar4 = plVar6 + 2;
  if (local_f8 == plVar4) {
    local_e8 = *plVar4;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar4;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar4;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_70._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar8) {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar8;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort(&local_70);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch = reason == TEST_DID_NOT_DIE       ? kDeathTestLived
                         : reason == TEST_THREW_EXCEPTION ? kDeathTestThrew
                                                          : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _Exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _Exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}